

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-utils.h
# Opt level: O0

void __thiscall
wasm::BranchUtils::BranchTargets::BranchTargets(BranchTargets *this,Expression *expr)

{
  Expression *local_18;
  Expression *expr_local;
  BranchTargets *this_local;
  
  local_18 = expr;
  expr_local = (Expression *)this;
  Inner::Inner(&this->inner);
  Walker<wasm::BranchUtils::BranchTargets::Inner,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchTargets::Inner,_void>_>
  ::walk((Walker<wasm::BranchUtils::BranchTargets::Inner,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchTargets::Inner,_void>_>
          *)this,&local_18);
  return;
}

Assistant:

BranchTargets(Expression* expr) { inner.walk(expr); }